

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int serial_change_baudrate(int baud)

{
  speed_t sVar1;
  int iVar2;
  speed_t baud_00;
  speed_t baud_01;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  uint *puVar6;
  char *pcVar7;
  speed_t osp;
  speed_t isp;
  termios term;
  char buf [2048];
  int errnum;
  int ret;
  termios newtio;
  int baud_local;
  
  newtio.c_ispeed = baud;
  memset(&errnum,0,0x3c);
  newtio.c_iflag = 0x800008b0;
  piVar5 = __errno_location();
  *piVar5 = 0;
  sVar1 = i2baud(newtio.c_ispeed);
  iVar2 = cfsetispeed((termios *)&errnum,sVar1);
  if (iVar2 < 0) {
    puVar6 = (uint *)__errno_location();
    uVar3 = *puVar6;
    yprintf(OUTPUT_LV_ERROR,"Error: Failed to set input baud rate to %d\n",(ulong)newtio.c_ispeed);
    pcVar7 = strerror(uVar3);
    yprintf(OUTPUT_LV_DEBUG,"Error: cfsetispeed: %s(%d)\n",pcVar7,(ulong)uVar3);
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0;
    sVar1 = i2baud(newtio.c_ispeed);
    iVar2 = cfsetospeed((termios *)&errnum,sVar1);
    if (iVar2 < 0) {
      puVar6 = (uint *)__errno_location();
      uVar3 = *puVar6;
      yprintf(OUTPUT_LV_ERROR,"Error: Failed to set output baud rate to %d\n",(ulong)newtio.c_ispeed
             );
      pcVar7 = strerror(uVar3);
      yprintf(OUTPUT_LV_DEBUG,"Error: cfsetospeed: %s(%d)\n",pcVar7,(ulong)uVar3);
    }
    else {
      SER_BAUDRATE = (double)(int)newtio.c_ispeed;
      errnum = 4;
      ret = 0;
      newtio.c_lflag._2_1_ = 0;
      newtio.c_lflag._3_1_ = 1;
      iVar2 = tcsetattr(g_device_port,2,(termios *)&errnum);
      if (iVar2 == 0) {
        piVar5 = __errno_location();
        *piVar5 = 0;
        iVar2 = tcgetattr(g_device_port,(termios *)&osp);
        if (iVar2 < 0) {
          puVar6 = (uint *)__errno_location();
          uVar3 = *puVar6;
          yprintf(OUTPUT_LV_ERROR,"Error: Failed to get  attribute of serial port\n");
          pcVar7 = strerror(uVar3);
          yprintf(OUTPUT_LV_DEBUG,"Error: tcgetattr: %s(%d)\n",pcVar7,(ulong)uVar3);
        }
        else {
          baud_00 = cfgetispeed((termios *)&osp);
          baud_01 = cfgetospeed((termios *)&osp);
          sVar1 = baud2i(baud_00);
          if ((sVar1 == newtio.c_ispeed) && (sVar1 = baud2i(baud_01), sVar1 == newtio.c_ispeed)) {
            iVar2 = option(OPTION_DO_NOT_USE_YP);
            if (iVar2 == 0) {
              write(g_device_port,"\n\nVV\n\n",6);
              yp_usleep(10000);
              serial_recieve(recieve_throw,&term.c_ispeed);
            }
            return 1;
          }
          sVar1 = newtio.c_ispeed;
          uVar3 = baud2i(baud_00);
          uVar4 = baud2i(baud_01);
          yprintf(OUTPUT_LV_ERROR,
                  "Error: Requested baudrate is %d/%d, \n   but sellected baudrate is %d/%d.\n",
                  (ulong)sVar1,(ulong)sVar1,(ulong)uVar3,(ulong)uVar4);
        }
      }
      else {
        puVar6 = (uint *)__errno_location();
        uVar3 = *puVar6;
        yprintf(OUTPUT_LV_ERROR,"Error: Failed to set attribute of serial port\n");
        pcVar7 = strerror(uVar3);
        yprintf(OUTPUT_LV_DEBUG,"Error: tcsetattr: %s(%d)\n",pcVar7,(ulong)uVar3);
      }
    }
  }
  return 0;
}

Assistant:

int serial_change_baudrate(int baud)
{
#if !defined(__MINGW32__)
  struct termios newtio;
  int ret, errnum;
  char buf[2048];

  memset(&newtio, 0, sizeof(newtio));  // 新しいポートの設定の構造体をクリアする

  // シリアルのボーレートを設定
  // 8bit 通信
  // スタートビット1
  // エンドビット１
  // パリティー無し
  // 合計 10bit

  newtio.c_cflag = CS8 | CLOCAL | CREAD | CRTSCTS;
  errno = 0;
  ret = cfsetispeed(&newtio, i2baud(baud));
  if (ret < 0)
  {
    errnum = errno;
    yprintf(OUTPUT_LV_ERROR, "Error: Failed to set input baud rate to %d\n", baud);
    yprintf(OUTPUT_LV_DEBUG, "Error: cfsetispeed: %s(%d)\n", strerror(errnum), errnum);
    return 0;
  }
  errno = 0;
  ret = cfsetospeed(&newtio, i2baud(baud));
  if (ret < 0)
  {
    errnum = errno;
    yprintf(OUTPUT_LV_ERROR, "Error: Failed to set output baud rate to %d\n", baud);
    yprintf(OUTPUT_LV_DEBUG, "Error: cfsetospeed: %s(%d)\n", strerror(errnum), errnum);
    return 0;
  }
  SER_BAUDRATE = (double)baud;
  newtio.c_iflag = IGNPAR;  // パリティエラーのデータは無視する
  newtio.c_oflag = 0;       // Disable implementation dependent processing

  newtio.c_cc[VTIME] = 0; /* キャラクタ間タイマを使わない */
  newtio.c_cc[VMIN] = 1;  /* 1文字来るまで，読み込みをブロックする */

  if (tcsetattr(g_device_port, TCSAFLUSH, &newtio))
  {
    errnum = errno;
    yprintf(OUTPUT_LV_ERROR, "Error: Failed to set attribute of serial port\n");
    yprintf(OUTPUT_LV_DEBUG, "Error: tcsetattr: %s(%d)\n", strerror(errnum), errnum);
    return 0;
  }

  {  // ---> check bit rate
    struct termios term;
    speed_t isp, osp;
    errno = 0;

    ret = tcgetattr(g_device_port, &term);
    if (ret < 0)
    {
      errnum = errno;
      yprintf(OUTPUT_LV_ERROR, "Error: Failed to get  attribute of serial port\n");
      yprintf(OUTPUT_LV_DEBUG, "Error: tcgetattr: %s(%d)\n", strerror(errnum), errnum);
      return 0;
    }
    isp = cfgetispeed(&term);
    osp = cfgetospeed(&term);

    if (baud2i(isp) != baud || baud2i(osp) != baud)
    {
      // fail to set bit rate
      yprintf(OUTPUT_LV_ERROR, "Error: Requested baudrate is %d/%d, \n   but sellected baudrate is %d/%d.\n",
              baud, baud, baud2i(isp), baud2i(osp));
      return 0;
    }
  }  // <--- check bit rate

  if (!(option(OPTION_DO_NOT_USE_YP)))
  {
    ret = write(g_device_port, "\n\nVV\n\n", 6);
    yp_usleep(10000);
    serial_recieve(recieve_throw, buf);
  }
#else
  // Windows用
  DCB dcb;

  // シリアルポートの状態操作
  GetCommState(g_hdevices, &dcb);  // シリアルポートの状態を取得
  dcb.fBinary = 1;
  dcb.fParity = 0;
  dcb.fOutxCtsFlow = 0;
  dcb.fOutxDsrFlow = 0;
  dcb.fDtrControl = DTR_CONTROL_DISABLE;
  dcb.fDsrSensitivity = FALSE;
  dcb.Parity = NOPARITY;
  dcb.StopBits = ONESTOPBIT;
  dcb.ByteSize = 8;
  dcb.BaudRate = i2baud(baud);
  SER_BAUDRATE = (double)baud;
  SetCommState(g_hdevices, &dcb);  // シリアルポートの状態を設定
#endif  // !defined(__MINGW32__)
  return 1;
}